

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::Temperature> metaf::Temperature::fromString(string *s)

{
  _Optional_base<metaf::Temperature,_true,_true> _Var1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  uint *puVar7;
  optional<unsigned_int> oVar8;
  string *in_RDI;
  Temperature temperature_1;
  optional<unsigned_int> t_1;
  Temperature temperature;
  optional<unsigned_int> t;
  optional<metaf::Temperature> error;
  Temperature *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  _Storage<unsigned_int,_true> _Var9;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 local_34 [12];
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  size_t local_10;
  size_t local_8;
  
  std::optional<metaf::Temperature>::optional((optional<metaf::Temperature> *)0x24cf83);
  bVar4 = std::operator==(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  if (bVar4) {
    memset(local_34,0,0xc);
    Temperature((Temperature *)in_stack_ffffffffffffffa0);
    std::optional<metaf::Temperature>::optional<metaf::Temperature,_true>
              ((optional<metaf::Temperature> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    sVar2 = local_10;
    sVar3 = local_8;
  }
  else {
    lVar5 = std::__cxx11::string::length();
    if (lVar5 == 3) {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
      sVar2 = in_stack_ffffffffffffffd8;
      sVar3 = in_stack_ffffffffffffffe0;
      if (*pcVar6 == 'M') {
        strToUint(in_RDI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        bVar4 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x24d02f);
        sVar2 = in_stack_ffffffffffffffd8;
        sVar3 = in_stack_ffffffffffffffe0;
        if (bVar4) {
          Temperature((Temperature *)in_stack_ffffffffffffffa0);
          puVar7 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x24d060);
          std::optional<int>::operator=
                    ((optional<int> *)CONCAT44(-*puVar7,in_stack_ffffffffffffffb0),
                     (uint *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          std::optional<metaf::Temperature>::optional<metaf::Temperature,_true>
                    ((optional<metaf::Temperature> *)in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98);
          sVar2 = local_10;
          sVar3 = local_8;
        }
      }
    }
    else {
      lVar5 = std::__cxx11::string::length();
      sVar2 = in_stack_ffffffffffffffd8;
      sVar3 = in_stack_ffffffffffffffe0;
      if (lVar5 == 2) {
        oVar8 = strToUint(in_RDI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        _Var9._M_value =
             oVar8.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload;
        uVar10 = oVar8.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._4_4_;
        bVar4 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x24d0c5);
        sVar2 = in_stack_ffffffffffffffd8;
        sVar3 = in_stack_ffffffffffffffe0;
        if (bVar4) {
          Temperature((Temperature *)in_stack_ffffffffffffffa0);
          std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x24d0f3);
          std::optional<int>::operator=
                    ((optional<int> *)CONCAT44(in_stack_ffffffffffffffb4,uVar10),
                     (uint *)CONCAT44(_Var9._M_value,in_stack_ffffffffffffffa8));
          std::optional<metaf::Temperature>::optional<metaf::Temperature,_true>
                    ((optional<metaf::Temperature> *)in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98);
          sVar2 = local_10;
          sVar3 = local_8;
        }
      }
    }
  }
  local_8 = sVar3;
  local_10 = sVar2;
  _Var1._M_payload.super__Optional_payload_base<metaf::Temperature>._8_8_ = local_8;
  _Var1._M_payload.super__Optional_payload_base<metaf::Temperature>._M_payload._M_value.tempValue.
  super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (optional<int>)(optional<int>)local_10;
  return (_Optional_base<metaf::Temperature,_true,_true>)
         (_Optional_base<metaf::Temperature,_true,_true>)
         _Var1._M_payload.super__Optional_payload_base<metaf::Temperature>;
}

Assistant:

std::optional<Temperature> Temperature::fromString(const std::string & s) {
	//static const std::regex rgx ("(?:(M)?(\\d\\d))|//");
	std::optional<Temperature> error;
	if (s == "//") return Temperature();
	if (s.length() == 3) {
		if (s[0] != 'M') return error;
		const auto t = strToUint(s, 1, 2);
		if (!t.has_value()) return error;
		Temperature temperature;
		temperature.tempValue = - *t;
		temperature.freezing = true;
		return temperature;
	}
	if (s.length() == 2) {
		const auto t = strToUint(s, 0, 2);
		if (!t.has_value()) return error;
		Temperature temperature;
		temperature.tempValue = *t;
		return temperature;
	}
	return error;
}